

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_handle_tIME(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  uint uVar1;
  int iVar2;
  char *error_message;
  png_byte buf [7];
  ushort local_1f [3];
  png_byte local_19;
  png_time local_18;
  
  uVar1 = png_ptr->mode;
  if ((uVar1 & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x200) == 0)) {
    if ((uVar1 & 4) != 0) {
      png_ptr->mode = uVar1 | 8;
    }
    if (length == 7) {
      png_crc_read(png_ptr,(png_bytep)local_1f,7);
      iVar2 = png_crc_finish(png_ptr,0);
      if (iVar2 == 0) {
        local_18.second = local_19;
        local_18._2_4_ = local_1f._2_4_;
        local_18.year = local_1f[0] << 8 | local_1f[0] >> 8;
        png_set_tIME(png_ptr,info_ptr,&local_18);
      }
      return;
    }
    png_crc_finish(png_ptr,length);
    error_message = "invalid";
  }
  else {
    png_crc_finish(png_ptr,length);
    error_message = "duplicate";
  }
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_tIME(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[7];
   png_time mod_time;

   png_debug(1, "in png_handle_tIME");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_tIME) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      png_ptr->mode |= PNG_AFTER_IDAT;

   if (length != 7)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 7);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   mod_time.second = buf[6];
   mod_time.minute = buf[5];
   mod_time.hour = buf[4];
   mod_time.day = buf[3];
   mod_time.month = buf[2];
   mod_time.year = png_get_uint_16(buf);

   png_set_tIME(png_ptr, info_ptr, &mod_time);
}